

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::buildGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,
          _geometry_shader_input gs_input,_geometry_shader_output gs_output,
          uint n_primitives_to_emit_in_stream0,uint n_streams)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  _geometry_shader_input gs_input_00;
  _geometry_shader_output gs_output_00;
  char *pcVar4;
  uint local_21c;
  uint local_218;
  uint n_vertex;
  uint n_primitive;
  uint n_primitives_to_emit;
  uint n_stream_2;
  uint n_output_primitive_vertices;
  uint n_stream_1;
  uint n_stream;
  uint n_vertices_required_for_gs_output;
  uint n_max_vertices;
  string gs_output_string;
  undefined1 local_1c8 [8];
  string gs_input_string;
  stringstream gs_body_sstream;
  ostream local_198;
  uint local_20;
  _geometry_shader_output local_1c;
  uint n_streams_local;
  uint n_primitives_to_emit_in_stream0_local;
  _geometry_shader_output gs_output_local;
  _geometry_shader_input gs_input_local;
  
  n_primitives_to_emit_in_stream0_local = (uint)this;
  local_20 = n_primitives_to_emit_in_stream0;
  local_1c = gs_output;
  n_streams_local = gs_input;
  _gs_output_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(gs_input_string.field_2._M_local_buf + 8));
  getGLSLStringForGSInput_abi_cxx11_
            ((string *)local_1c8,
             (PipelineStatisticsQueryUtilities *)(ulong)n_primitives_to_emit_in_stream0_local,
             gs_input_00);
  getGLSLStringForGSOutput_abi_cxx11_
            ((string *)&n_vertices_required_for_gs_output,
             (PipelineStatisticsQueryUtilities *)(ulong)n_streams_local,gs_output_00);
  n_stream = 0;
  uVar1 = getNumberOfVerticesForGSOutput(n_streams_local);
  for (n_output_primitive_vertices = 0; n_output_primitive_vertices < local_20;
      n_output_primitive_vertices = n_output_primitive_vertices + 1) {
    n_stream = uVar1 * (local_1c + n_output_primitive_vertices) + n_stream;
  }
  pcVar4 = "#version 150\n";
  if (1 < local_20) {
    pcVar4 = "#version 400";
  }
  poVar3 = std::operator<<(&local_198,pcVar4);
  poVar3 = std::operator<<(poVar3,"\nlayout(");
  poVar3 = std::operator<<(poVar3,(string *)local_1c8);
  poVar3 = std::operator<<(poVar3,")                 in;\nlayout(");
  poVar3 = std::operator<<(poVar3,(string *)&n_vertices_required_for_gs_output);
  poVar3 = std::operator<<(poVar3,", max_vertices=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_stream);
  std::operator<<(poVar3,") out;\n");
  if (1 < local_20) {
    std::operator<<(&local_198,"\n");
    for (n_stream_2 = 0; n_stream_2 < local_20; n_stream_2 = n_stream_2 + 1) {
      poVar3 = std::operator<<(&local_198,"layout(stream = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_stream_2);
      poVar3 = std::operator<<(poVar3,") out vec4 out_stream");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_stream_2);
      std::operator<<(poVar3,";\n");
    }
  }
  std::operator<<(&local_198,"\nvoid main()\n{\n");
  uVar1 = getNumberOfVerticesForGSOutput(n_streams_local);
  for (n_primitive = 0; n_primitive < local_20; n_primitive = n_primitive + 1) {
    uVar2 = local_1c + n_primitive;
    for (local_218 = 0; local_218 < uVar2; local_218 = local_218 + 1) {
      for (local_21c = 0; local_21c < uVar1; local_21c = local_21c + 1) {
        std::operator<<(&local_198,"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n");
        if (local_20 == 1) {
          std::operator<<(&local_198,"    EmitVertex();\n");
        }
        else {
          poVar3 = std::operator<<(&local_198,"    EmitStreamVertex(");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_primitive);
          std::operator<<(poVar3,");\n");
        }
      }
      if (local_20 == 1) {
        std::operator<<(&local_198,"    EndPrimitive();\n");
      }
      else {
        poVar3 = std::operator<<(&local_198,"    EndStreamPrimitive(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,n_primitive);
        std::operator<<(poVar3,");\n");
      }
    }
  }
  std::operator<<(&local_198,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)&n_vertices_required_for_gs_output);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(gs_input_string.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::buildGeometryShaderBody(_geometry_shader_input  gs_input,
																	  _geometry_shader_output gs_output,
																	  unsigned int n_primitives_to_emit_in_stream0,
																	  unsigned int n_streams)
{
	DE_ASSERT(n_primitives_to_emit_in_stream0 >= 1);
	DE_ASSERT(n_streams >= 1);

	/* Each stream will output (n+1) primitives, where n corresponds to the number of primitives emitted
	 * by the previous stream. Stream 0 emits user-defined number of primitievs.
	 */
	std::stringstream gs_body_sstream;
	const std::string gs_input_string  = getGLSLStringForGSInput(gs_input);
	const std::string gs_output_string = getGLSLStringForGSOutput(gs_output);
	unsigned int	  n_max_vertices   = 0;
	unsigned int	  n_vertices_required_for_gs_output =
		PipelineStatisticsQueryUtilities::getNumberOfVerticesForGSOutput(gs_output);

	for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
	{
		n_max_vertices += n_vertices_required_for_gs_output * (n_primitives_to_emit_in_stream0 + n_stream);
	} /* for (all streams) */

	/* Form the preamble. Note that we need to use the right ES SL version,
	 * since vertex streams are not a core GL3.2 feature.
	 **/
	gs_body_sstream << ((n_streams > 1) ? "#version 400" : "#version 150\n") << "\n"
																				"layout("
					<< gs_input_string << ")                 in;\n"
										  "layout("
					<< gs_output_string << ", max_vertices=" << n_max_vertices << ") out;\n";

	/* If we need to define multiple streams, do it now */
	if (n_streams > 1)
	{
		gs_body_sstream << "\n";

		for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
		{
			gs_body_sstream << "layout(stream = " << n_stream << ") out vec4 out_stream" << n_stream << ";\n";
		} /* for (all streams) */
	}	 /* if (n_streams > 1) */

	/* Contine forming actual body */
	gs_body_sstream << "\n"
					   "void main()\n"
					   "{\n";

	/* Emit primitives */
	const unsigned int n_output_primitive_vertices =
		PipelineStatisticsQueryUtilities::getNumberOfVerticesForGSOutput(gs_output);

	for (unsigned int n_stream = 0; n_stream < n_streams; ++n_stream)
	{
		const unsigned int n_primitives_to_emit = n_primitives_to_emit_in_stream0 + n_stream;

		for (unsigned int n_primitive = 0; n_primitive < n_primitives_to_emit; ++n_primitive)
		{
			for (unsigned int n_vertex = 0; n_vertex < n_output_primitive_vertices; ++n_vertex)
			{
				gs_body_sstream << "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n";

				if (n_streams == 1)
				{
					gs_body_sstream << "    EmitVertex();\n";
				}
				else
				{
					gs_body_sstream << "    EmitStreamVertex(" << n_stream << ");\n";
				}
			}

			if (n_streams == 1)
			{
				gs_body_sstream << "    EndPrimitive();\n";
			}
			else
			{
				gs_body_sstream << "    EndStreamPrimitive(" << n_stream << ");\n";
			}
		} /* for (all primitives the caller wants the shader to emit) */
	}	 /* for (all streams) */

	gs_body_sstream << "}\n";

	return gs_body_sstream.str();
}